

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# feature_resolver_test.cc
# Opt level: O3

void __thiscall
google::protobuf::anon_unknown_0::FeatureResolverTest_CompileDefaultsMissingExtension_Test::TestBody
          (FeatureResolverTest_CompileDefaultsMissingExtension_Test *this)

{
  char *message;
  Metadata MVar1;
  Span<const_google::protobuf::FieldDescriptor_*const> extensions;
  char cVar2;
  Edition in_stack_ffffffffffffff28;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_d0;
  AssertHelper local_c8;
  StatusOr<google::protobuf::FeatureSetDefaults> *local_c0;
  undefined1 local_b8 [16];
  anon_union_8_1_1246618d_for_StatusOrData<google::protobuf::FeatureSetDefaults>_1 local_a8;
  long local_a0;
  long local_98 [6];
  long *local_68;
  long local_60;
  long local_58 [2];
  PolymorphicMatcher<testing::internal::HasSubstrMatcher<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_48;
  SymbolBase local_28;
  undefined3 uStack_27;
  uint16_t uStack_24;
  undefined2 uStack_22;
  
  testing::HasSubstr<char[18]>(&local_48,(StringLike<char[18]> *)"Unknown extension");
  local_a8 = (anon_union_8_1_1246618d_for_StatusOrData<google::protobuf::FeatureSetDefaults>_1)
             local_98;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_a8,local_48.impl_.substring_._M_dataplus._M_p,
             local_48.impl_.substring_._M_dataplus._M_p + local_48.impl_.substring_._M_string_length
            );
  local_68 = local_58;
  std::__cxx11::string::_M_construct<char*>((string *)&local_68,local_a8,local_a0 + (long)local_a8);
  if (local_a8 !=
      (anon_union_8_1_1246618d_for_StatusOrData<google::protobuf::FeatureSetDefaults>_1)local_98) {
    operator_delete((void *)local_a8,local_98[0] + 1);
  }
  local_a8 = (anon_union_8_1_1246618d_for_StatusOrData<google::protobuf::FeatureSetDefaults>_1)
             local_98;
  std::__cxx11::string::_M_construct<char*>((string *)&local_a8,local_68,local_60 + (long)local_68);
  local_c8.data_ = (AssertHelperData *)local_b8;
  std::__cxx11::string::_M_construct<char*>((string *)&local_c8,local_a8,local_a0 + (long)local_a8);
  if (local_a8 !=
      (anon_union_8_1_1246618d_for_StatusOrData<google::protobuf::FeatureSetDefaults>_1)local_98) {
    operator_delete((void *)local_a8,local_98[0] + 1);
  }
  MVar1 = FeatureSet::GetMetadata((FeatureSet *)&_FeatureSet_default_instance_);
  local_28.symbol_type_ = '\0';
  uStack_27 = 0;
  uStack_24 = 0;
  uStack_22 = 0;
  extensions.len_ = 1000;
  extensions.ptr_ = (pointer)0x1;
  FeatureResolver::CompileDefaults
            ((StatusOr<google::protobuf::FeatureSetDefaults> *)&local_a8.status_,
             (FeatureResolver *)MVar1.descriptor,(Descriptor *)&stack0xffffffffffffffd8,extensions,
             EDITION_2023,in_stack_ffffffffffffff28);
  cVar2 = (char)in_stack_ffffffffffffff28;
  testing::internal::
  PredicateFormatterFromMatcher<google::protobuf::(anonymous_namespace)::HasErrorMatcherP<testing::PolymorphicMatcher<testing::internal::HasSubstrMatcher<std::__cxx11::string>>>>
  ::operator()(&stack0xffffffffffffff28,(char *)local_c8.data_,local_c0);
  absl::lts_20250127::internal_statusor::StatusOrData<google::protobuf::FeatureSetDefaults>::
  ~StatusOrData((StatusOrData<google::protobuf::FeatureSetDefaults> *)&local_a8.status_);
  if (local_c8.data_ != (AssertHelperData *)local_b8) {
    operator_delete(local_c8.data_,local_b8._0_8_ + 1);
  }
  if (local_68 != local_58) {
    operator_delete(local_68,local_58[0] + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_48.impl_.substring_._M_dataplus._M_p != &local_48.impl_.substring_.field_2) {
    operator_delete(local_48.impl_.substring_._M_dataplus._M_p,
                    local_48.impl_.substring_.field_2._M_allocated_capacity + 1);
  }
  if (cVar2 == '\0') {
    testing::Message::Message((Message *)&local_a8.status_);
    if (local_d0 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      message = anon_var_dwarf_a22956 + 5;
    }
    else {
      message = (local_d0->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_c8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/feature_resolver_test.cc"
               ,0x1a5,message);
    testing::internal::AssertHelper::operator=(&local_c8,(Message *)&local_a8.status_);
    testing::internal::AssertHelper::~AssertHelper(&local_c8);
    if (local_a8 !=
        (anon_union_8_1_1246618d_for_StatusOrData<google::protobuf::FeatureSetDefaults>_1)0x0) {
      (**(code **)(*(long *)local_a8 + 8))();
    }
  }
  if (local_d0 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_d0,local_d0);
  }
  return;
}

Assistant:

TEST(FeatureResolverTest, CompileDefaultsMissingExtension) {
  EXPECT_THAT(
      FeatureResolver::CompileDefaults(FeatureSet::descriptor(), {nullptr},
                                       EDITION_2023, EDITION_2023),
      HasError(HasSubstr("Unknown extension")));
}